

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
::CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
           *this,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
                 *g)

{
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  *in_RDI;
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  *in_stack_ffffffffffffffe0;
  
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  ::ParamGeneratorInterface
            ((ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
              *)in_RDI);
  *(undefined ***)
   &(in_RDI->
    super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    ).
    super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    .
    super__Tuple_impl<2UL,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
    .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
    super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_ =
       &PTR__CartesianProductGenerator_01fa0e28;
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamGenerator<int>_>
  ::tuple(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

CartesianProductGenerator(const std::tuple<ParamGenerator<T>...>& g)
      : generators_(g) {}